

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O2

void proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  Nullable<const_char_*> failure_msg;
  MyMessagePlusExtra *_this;
  MyMessagePlusExtra *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (MyMessagePlusExtra *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra_const*,proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra*>
                          ((MyMessagePlusExtra **)local_18,&local_20,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_preserve_unknown_enum.pb.cc"
               ,0x424,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_20->field_0)._impl_.repeated_e_,
             (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_20->field_0)._impl_.repeated_packed_e_,(RepeatedField<int> *)(from_msg + 3));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_20->field_0)._impl_.repeated_packed_unexpected_e_,
             (RepeatedField<int> *)&from_msg[4]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if (((uVar1 & 1) != 0) &&
     (iVar2 = *(int *)((long)&from_msg[5]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
    (local_20->field_0)._impl_.e_ = iVar2;
  }
  (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  uVar3 = *(uint32_t *)((long)&from_msg[6]._vptr_MessageLite + 4);
  if (uVar3 != 0) {
    if ((local_20->field_0)._impl_._oneof_case_[0] != uVar3) {
      (local_20->field_0)._impl_._oneof_case_[0] = uVar3;
    }
    if (uVar3 - 5 < 2) {
      *(undefined4 *)((long)&local_20->field_0 + 0x50) =
           *(undefined4 *)&from_msg[6]._vptr_MessageLite;
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_20->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void MyMessagePlusExtra::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<MyMessagePlusExtra*>(&to_msg);
  auto& from = static_cast<const MyMessagePlusExtra&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_preserve_unknown_enum_unittest.MyMessagePlusExtra)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_e()->MergeFrom(from._internal_repeated_e());
  _this->_internal_mutable_repeated_packed_e()->MergeFrom(from._internal_repeated_packed_e());
  _this->_internal_mutable_repeated_packed_unexpected_e()->MergeFrom(from._internal_repeated_packed_unexpected_e());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (from._internal_e() != 0) {
      _this->_impl_.e_ = from._impl_.e_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_o();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofE1: {
        _this->_impl_.o_.oneof_e_1_ = from._impl_.o_.oneof_e_1_;
        break;
      }
      case kOneofE2: {
        _this->_impl_.o_.oneof_e_2_ = from._impl_.o_.oneof_e_2_;
        break;
      }
      case O_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}